

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf2.c
# Opt level: O1

void gf2RedPentanomial(word *a,size_t n,gf2_pentanom_st *p)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = n * 2;
  while( true ) {
    uVar3 = uVar4 - 1;
    if (uVar3 <= p->wm) break;
    puVar1 = a + uVar3;
    uVar2 = *puVar1;
    uVar5 = uVar2 << (-(char)p->bm & 0x3fU);
    if (p->bm == 0) {
      uVar5 = 0;
    }
    a[(uVar4 - 2) - p->wm] = a[(uVar4 - 2) - p->wm] ^ uVar5;
    puVar1[-p->wm] = puVar1[-p->wm] ^ uVar2 >> ((byte)p->bm & 0x3f);
    uVar5 = uVar2 << (-(char)p->bl1 & 0x3fU);
    if (p->bl1 == 0) {
      uVar5 = 0;
    }
    a[(uVar4 - 2) - p->wl1] = a[(uVar4 - 2) - p->wl1] ^ uVar5;
    puVar1[-p->wl1] = puVar1[-p->wl1] ^ uVar2 >> ((byte)p->bl1 & 0x3f);
    uVar5 = uVar2 << (-(char)p->bl & 0x3fU);
    if (p->bl == 0) {
      uVar5 = 0;
    }
    a[(uVar4 - 2) - p->wl] = a[(uVar4 - 2) - p->wl] ^ uVar5;
    puVar1[-p->wl] = puVar1[-p->wl] ^ uVar2 >> ((byte)p->bl & 0x3f);
    uVar5 = uVar2 << (-(char)p->bk & 0x3fU);
    if (p->bk == 0) {
      uVar5 = 0;
    }
    a[(uVar4 - 2) - p->wk] = a[(uVar4 - 2) - p->wk] ^ uVar5;
    puVar1[-p->wk] = puVar1[-p->wk] ^ uVar2 >> ((byte)p->bk & 0x3f);
    uVar4 = uVar3;
  }
  puVar1 = a + uVar3;
  uVar4 = *puVar1 >> ((byte)p->bm & 0x3f);
  *a = *a ^ uVar4;
  uVar4 = uVar4 << ((byte)p->bm & 0x3f);
  if ((p->wl1 < uVar3) && (p->bl1 != 0)) {
    puVar1[~p->wl1] = puVar1[~p->wl1] ^ uVar4 << (-(char)p->bl1 & 0x3fU);
  }
  a[uVar3 - p->wl1] = a[uVar3 - p->wl1] ^ uVar4 >> ((byte)p->bl1 & 0x3f);
  if ((p->wl < uVar3) && (p->bl != 0)) {
    puVar1[~p->wl] = puVar1[~p->wl] ^ uVar4 << (-(char)p->bl & 0x3fU);
  }
  a[uVar3 - p->wl] = a[uVar3 - p->wl] ^ uVar4 >> ((byte)p->bl & 0x3f);
  if ((p->wk < uVar3) && (p->bk != 0)) {
    puVar1[~p->wk] = puVar1[~p->wk] ^ uVar4 << (-(char)p->bk & 0x3fU);
  }
  a[uVar3 - p->wk] = a[uVar3 - p->wk] ^ uVar4 >> ((byte)p->bk & 0x3f);
  a[uVar3] = a[uVar3] ^ uVar4;
  return;
}

Assistant:

static void gf2RedPentanomial(word a[], size_t n, const gf2_pentanom_st* p)
{
	register word hi;
	// pre
	ASSERT(wwIsValid(a, 2 * n));
	ASSERT(memIsValid(p, sizeof(*p)));
	ASSERT(p->m > p->k && p->k > p->l && p->l > p->l1 && p->l1 > 0);
	ASSERT(p->k < B_PER_W);
	ASSERT(p->m - p->k >= B_PER_W);
	ASSERT(p->bm < B_PER_W && p->bk < B_PER_W);
	ASSERT(p->bl < B_PER_W && p->bl1 < B_PER_W);
	ASSERT(p->m == B_PER_W * p->wm + p->bm);
	ASSERT(p->m == p->k + B_PER_W * p->wk + p->bk);
	ASSERT(p->m == p->l + B_PER_W * p->wl + p->bl);
	ASSERT(p->m == p->l1 + B_PER_W * p->wl1 + p->bl1);
	ASSERT(n == W_OF_B(p->m));
	// обрабатываем старшие слова
	n *= 2;
	while (--n > p->wm)
	{
		hi = a[n];
		a[n - p->wm - 1] ^= p->bm ? hi << (B_PER_W - p->bm) : 0;
		a[n - p->wm] ^= hi >> p->bm;
		a[n - p->wl1 - 1] ^= p->bl1 ? hi << (B_PER_W - p->bl1) : 0;
		a[n - p->wl1] ^= hi >> p->bl1;
		a[n - p->wl - 1] ^= p->bl ? hi << (B_PER_W - p->bl) : 0;
		a[n - p->wl] ^= hi >> p->bl;
		a[n - p->wk - 1] ^= p->bk ? hi << (B_PER_W - p->bk) : 0;
		a[n - p->wk] ^= hi >> p->bk;
	}
	// слово, на которое попадает моном x^m
	ASSERT(n == p->wm);
	hi = a[n] >> p->bm;
	a[0] ^= hi;
	hi <<= p->bm;
	if (p->wl1 < n && p->bl1)
		a[n - p->wl1 - 1] ^= hi << (B_PER_W - p->bl1);
	a[n - p->wl1] ^= hi >> p->bl1;
	if (p->wl < n && p->bl)
		a[n - p->wl - 1] ^= hi << (B_PER_W - p->bl);
	a[n - p->wl] ^= hi >> p->bl;
	if (p->wk < n && p->bk)
		a[n - p->wk - 1] ^= hi << (B_PER_W - p->bk);
	a[n - p->wk] ^= hi >> p->bk;
	a[n] ^= hi;
	// очистка
	hi = 0;
}